

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O2

void __thiscall
LZ77Compressor::compress<LZ77Compressor::DefaultEncode&>
          (LZ77Compressor *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *out,
          uint8_t *input,int inputLength,DefaultEncode *encode)

{
  pointer puVar1;
  pointer pIVar2;
  int iVar3;
  vector<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_> *pvVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  puVar1 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar1) {
    (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar1;
  }
  pvVar4 = compress(this,input,inputLength);
  lVar7 = 0;
  uVar6 = 0;
  while( true ) {
    pIVar2 = (pvVar4->
             super__Vector_base<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar5 = ((long)(pvVar4->
                   super__Vector_base<LZ77Compressor::Item,_std::allocator<LZ77Compressor::Item>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)pIVar2) / 6;
    iVar3 = (int)uVar5;
    if ((long)(iVar3 + -7) <= (long)uVar6) break;
    compress_helper<LZ77Compressor::DefaultEncode>
              (this,out,(Item *)(&pIVar2->isRepeat + lVar7),8,encode);
    uVar6 = uVar6 + 8;
    lVar7 = lVar7 + 0x30;
  }
  if (uVar6 < uVar5) {
    compress_helper<LZ77Compressor::DefaultEncode>
              (this,out,(Item *)(&pIVar2->isRepeat + lVar7),iVar3 - (int)uVar6,encode);
    return;
  }
  return;
}

Assistant:

void compress(std::vector<uint8_t>& out, const uint8_t* input, int inputLength, Fn&& encode) {
		out.clear();
		const auto& vec = compress(input, inputLength);
		int i = 0;
		for (; i < static_cast<int>(vec.size()) - 7; i += 8) {
			compress_helper(out, &vec[i], 8, encode);
		}
		if (i < vec.size()) {
			compress_helper(out, &vec[i], vec.size() - i, encode);
		}
	}